

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O1

void __thiscall Hpipe::BranchSet::BranchSet(BranchSet *this,Vec<Hpipe::BranchSet::Range> *ranges)

{
  int iVar1;
  int iVar2;
  pointer pRVar3;
  pointer pRVar4;
  Node *data;
  long lVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Instruction *pIVar9;
  double dVar10;
  int iVar11;
  ulong uVar12;
  Node *pNVar13;
  __normal_iterator<Hpipe::BranchSet::Range_*,_std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>_>
  __i;
  pointer pRVar14;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  (this->root).data = (Node *)0x0;
  pRVar3 = (ranges->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
           .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (ranges->super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>)
           .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar4) {
    uVar12 = (long)pRVar4 - (long)pRVar3 >> 5;
    lVar5 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::BranchSet::_Iter_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
              (pRVar3,pRVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pRVar4 - (long)pRVar3 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::BranchSet::_Iter_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
                (pRVar3,pRVar4);
    }
    else {
      pRVar14 = pRVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::BranchSet::Range*,std::vector<Hpipe::BranchSet::Range,std::allocator<Hpipe::BranchSet::Range>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::BranchSet::_Iter_comp_iter(Hpipe::Vec<Hpipe::BranchSet::Range>)::__0>>
                (pRVar3,pRVar14);
      for (; pRVar14 != pRVar4; pRVar14 = pRVar14 + 1) {
        iVar2 = pRVar14->beg;
        dVar6 = pRVar14->freq;
        uStack_38 = (undefined4)((ulong)pRVar14->name >> 0x20);
        uVar7 = *(undefined8 *)&pRVar14->end;
        uVar8 = *(undefined8 *)((long)&pRVar14->inst + 4);
        local_3c = (undefined4)((ulong)uVar8 >> 0x20);
        iVar1 = pRVar14[-1].beg;
        pRVar3 = pRVar14;
        while (iVar2 < iVar1) {
          iVar1 = pRVar3[-1].beg;
          iVar11 = pRVar3[-1].end;
          pIVar9 = pRVar3[-1].inst;
          dVar10 = pRVar3[-1].freq;
          pRVar3->name = pRVar3[-1].name;
          pRVar3->freq = dVar10;
          pRVar3->beg = iVar1;
          pRVar3->end = iVar11;
          pRVar3->inst = pIVar9;
          iVar1 = pRVar3[-2].beg;
          pRVar3 = pRVar3 + -1;
        }
        pRVar3->beg = iVar2;
        *(undefined8 *)&pRVar3->end = uVar7;
        *(undefined8 *)((long)&pRVar3->inst + 4) = uVar8;
        pRVar3->name = (char *)CONCAT44(uStack_38,local_3c);
        pRVar3->freq = dVar6;
      }
    }
  }
  pNVar13 = make_choice(this,ranges);
  data = (this->root).data;
  if (data != (Node *)0x0) {
    Delete::operator()((Delete *)&(this->root).field_0x8,data);
  }
  (this->root).data = pNVar13;
  return;
}

Assistant:

BranchSet::BranchSet( Vec<Range> ranges ) {
    std::sort( ranges.begin(), ranges.end(), []( const Range &a, const Range &b ) {
        return a.beg < b.beg;
    } );

    root = make_choice( ranges );
    cost_and_freq( root.ptr(), 0 );
}